

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O1

void __thiscall DecHeap::bubble_up(DecHeap *this,size_t idx)

{
  ulong uVar1;
  pointer ppVar2;
  pointer puVar3;
  ulong uVar4;
  unsigned_long uVar5;
  ulong uVar6;
  pointer ppVar7;
  pointer ppVar8;
  unsigned_long __tmp;
  
  if (idx != 0) {
    ppVar2 = (this->heap).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->idx_map).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      uVar1 = idx - 1;
      uVar6 = uVar1 >> 1;
      uVar4 = ppVar2[uVar6].first;
      if (uVar4 <= ppVar2[idx].first) {
        return;
      }
      ppVar7 = ppVar2 + uVar6;
      ppVar8 = ppVar2 + idx;
      ppVar7->first = ppVar2[idx].first;
      ppVar8->first = uVar4;
      uVar5 = ppVar7->second;
      ppVar7->second = ppVar8->second;
      ppVar8->second = uVar5;
      puVar3[ppVar7->second] = uVar6;
      puVar3[ppVar8->second] = idx;
      idx = uVar6;
    } while (1 < uVar1);
  }
  return;
}

Assistant:

void DecHeap::bubble_up(size_t idx) {
    while (idx && heap[(idx - 1)/2].first > heap[idx].first) {
        this->swap((idx - 1)/2, idx);
        idx = (idx - 1) / 2;
    }
}